

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O1

void hydro_kx_aead_init(uint8_t *aead_state,uint8_t *k,hydro_kx_state *state)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *dst;
  uchar *src;
  
  hydro_hash_final(&state->h_st,k,0x20);
  aead_state[8] = '\0';
  aead_state[9] = '\0';
  aead_state[10] = '\0';
  aead_state[0xb] = '\0';
  aead_state[0xc] = '\0';
  aead_state[0xd] = '\0';
  aead_state[0xe] = '\0';
  aead_state[0xf] = '\0';
  aead_state[0x10] = '\0';
  aead_state[0x11] = '\0';
  aead_state[0x12] = '\0';
  aead_state[0x13] = '\0';
  aead_state[0x14] = '\0';
  aead_state[0x15] = '\0';
  aead_state[0x16] = '\0';
  aead_state[0x17] = '\0';
  aead_state[0x18] = '\0';
  aead_state[0x19] = '\0';
  aead_state[0x1a] = '\0';
  aead_state[0x1b] = '\0';
  aead_state[0x1c] = '\0';
  aead_state[0x1d] = '\0';
  aead_state[0x1e] = '\0';
  aead_state[0x1f] = '\0';
  aead_state[0x20] = '\0';
  aead_state[0x21] = '\0';
  aead_state[0x22] = '\0';
  aead_state[0x23] = '\0';
  aead_state[0x24] = '\0';
  aead_state[0x25] = '\0';
  aead_state[0x26] = '\0';
  aead_state[0x27] = '\0';
  aead_state[0x28] = '\0';
  aead_state[0x29] = '\0';
  aead_state[0x2a] = '\0';
  aead_state[0x2b] = '\0';
  aead_state[0x2c] = '\0';
  aead_state[0x2d] = '\0';
  aead_state[0x2e] = '\0';
  aead_state[0x2f] = '\0';
  aead_state[0] = '\x06';
  aead_state[1] = 'k';
  aead_state[2] = 'x';
  aead_state[3] = 'x';
  aead_state[4] = '2';
  aead_state[5] = '5';
  aead_state[6] = '6';
  aead_state[7] = '\0';
  gimli_core_u8(aead_state,'\x01');
  uVar1 = *(uint *)(k + 4);
  uVar2 = *(uint *)(k + 8);
  uVar3 = *(uint *)(k + 0xc);
  *(uint *)aead_state = *(uint *)aead_state ^ *(uint *)k;
  *(uint *)(aead_state + 4) = *(uint *)(aead_state + 4) ^ uVar1;
  *(uint *)(aead_state + 8) = *(uint *)(aead_state + 8) ^ uVar2;
  *(uint *)(aead_state + 0xc) = *(uint *)(aead_state + 0xc) ^ uVar3;
  gimli_core_u8(aead_state,0xff);
  uVar1 = *(uint *)(k + 0x14);
  uVar2 = *(uint *)(k + 0x18);
  uVar3 = *(uint *)(k + 0x1c);
  *(uint *)aead_state = *(uint *)aead_state ^ *(uint *)(k + 0x10);
  *(uint *)(aead_state + 4) = *(uint *)(aead_state + 4) ^ uVar1;
  *(uint *)(aead_state + 8) = *(uint *)(aead_state + 8) ^ uVar2;
  *(uint *)(aead_state + 0xc) = *(uint *)(aead_state + 0xc) ^ uVar3;
  gimli_core_u8(aead_state,0xff);
  return;
}

Assistant:

static void
hydro_kx_aead_init(uint8_t aead_state[gimli_BLOCKBYTES], uint8_t k[hydro_kx_AEAD_KEYBYTES],
                   hydro_kx_state *state)
{
    static const uint8_t prefix[] = { 6, 'k', 'x', 'x', '2', '5', '6', 0 };

    hydro_hash_final(&state->h_st, k, hydro_kx_AEAD_KEYBYTES);

    mem_zero(aead_state + sizeof prefix, gimli_BLOCKBYTES - sizeof prefix);
    memcpy(aead_state, prefix, sizeof prefix);
    gimli_core_u8(aead_state, gimli_TAG_HEADER);

    COMPILER_ASSERT(hydro_kx_AEAD_KEYBYTES == 2 * gimli_RATE);
    mem_xor(aead_state, k, gimli_RATE);
    gimli_core_u8(aead_state, gimli_TAG_KEY);
    mem_xor(aead_state, k + gimli_RATE, gimli_RATE);
    gimli_core_u8(aead_state, gimli_TAG_KEY);
}